

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeWebAssemblyModulePrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *pSVar2;
  undefined8 in_RAX;
  uint uVar4;
  StaticType *type;
  LiteralString *pLVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,2,0);
  pJVar1 = (((prototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar2 = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (prototype,0x67,(pJVar1->webAssemblyModuleConstructor).ptr,6,0,0,uVar5);
  if (((pSVar2->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    pLVar3 = LiteralString::New(type,L"WebAssembly.Module",0x12,pJVar1->recycler);
    (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x1b,pLVar3,2,0,0,uVar5 & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyModulePrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 2);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyModuleConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Module")), PropertyConfigurable);
        }
        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }